

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void CVmObjDict::save_file_cb(void *ctx0,CVmHashEntry *entry0)

{
  _func_int **pp_Var1;
  int iVar2;
  CVmHashEntry *pCVar3;
  uint v;
  CVmHashEntry *pCVar4;
  
  CVmFile::write_uint2(*ctx0,(uint)entry0->len_);
  CVmFile::write_bytes(*ctx0,entry0->str_,entry0->len_);
  v = 0;
  pCVar3 = entry0 + 1;
  pCVar4 = pCVar3;
  while (pp_Var1 = pCVar4->_vptr_CVmHashEntry, pp_Var1 != (_func_int **)0x0) {
    iVar2 = CVmObjTable::is_obj_persistent(&G_obj_table_X,*(vm_obj_id_t *)pp_Var1);
    v = (v + 1) - (uint)(iVar2 == 0);
    pCVar4 = (CVmHashEntry *)(pp_Var1 + 1);
  }
  if (v != 0) {
    *(long *)((long)ctx0 + 8) = *(long *)((long)ctx0 + 8) + 1;
    CVmFile::write_uint2(*ctx0,v);
    while (pp_Var1 = pCVar3->_vptr_CVmHashEntry, pp_Var1 != (_func_int **)0x0) {
      iVar2 = CVmObjTable::is_obj_persistent(&G_obj_table_X,*(vm_obj_id_t *)pp_Var1);
      if (iVar2 != 0) {
        CVmFile::write_uint4(*ctx0,*(uint *)pp_Var1);
        CVmFile::write_uint2(*ctx0,(uint)*(ushort *)((long)pp_Var1 + 4));
      }
      pCVar3 = (CVmHashEntry *)(pp_Var1 + 1);
    }
  }
  return;
}

Assistant:

void CVmObjDict::save_file_cb(void *ctx0, CVmHashEntry *entry0)
{
    save_file_ctx *ctx = (save_file_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;
    uint cnt;

    /* set up global access */
    VMGLOB_PTR(ctx->vmg);

    /* write out this entry's name */
    ctx->fp->write_uint2(entry->getlen());
    ctx->fp->write_bytes(entry->getstr(), entry->getlen());

    /* count the items in this entry's list */
    for (cnt = 0, cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* 
         *   if the referenced object is persistent, count this item;
         *   don't count items that refer to non-persistent items, because
         *   these objects will not be saved to the file and hence will
         *   not be present when the saved state is restored 
         */
        if (G_obj_table->is_obj_persistent(cur->obj_))
            ++cnt;
    }

    /* 
     *   if there are no saveable items for this entry, do not write out
     *   the entry at all 
     */
    if (cnt == 0)
        return;

    /* count this entry */
    ++ctx->cnt;

    /* write the item count */
    ctx->fp->write_uint2(cnt);

    /* write out each item in this entry's list */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this item's object is persistent, write out the item */
        if (G_obj_table->is_obj_persistent(cur->obj_))
        {
            /* write out the object and property for this entry */
            ctx->fp->write_uint4((long)cur->obj_);
            ctx->fp->write_uint2((int)cur->prop_);
        }
    }
}